

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O0

void __thiscall DisplayNCurses::render(DisplayNCurses *this,SatLookAngles *sats)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  string *psVar5;
  ITEM **this_00;
  _Setw _Var6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  string *psVar10;
  size_t *psVar11;
  ostream *poVar12;
  int *piVar13;
  WINDOW *win_00;
  WINDOW *win_01;
  undefined8 uVar14;
  undefined8 uVar15;
  MENU *menu_00;
  undefined8 uVar16;
  SatLookAngle *sat;
  string *this_01;
  ulong uVar17;
  int local_350;
  string *local_278;
  ulong local_248;
  size_t i;
  ITEM *ci;
  int c;
  int msecs;
  MENU *menu;
  bool showInfo;
  PANEL *mainPanel;
  PANEL *infoPanel;
  WINDOW *infoWin;
  WINDOW *win;
  int local_1f8;
  int cols;
  string local_1f0 [4];
  int rows;
  string colNames;
  stringstream local_1b0 [8];
  stringstream ss;
  undefined1 local_1a0 [376];
  string *local_28;
  string *itemStrs;
  ITEM **items;
  SatLookAngles *sats_local;
  DisplayNCurses *this_local;
  
  items = (ITEM **)sats;
  sats_local = (SatLookAngles *)this;
  sVar8 = SatLookAngles::size(sats);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar8 + 1;
  uVar9 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  psVar10 = (string *)operator_new__(uVar9);
  memset(psVar10,0,uVar9);
  itemStrs = psVar10;
  sVar8 = SatLookAngles::size((SatLookAngles *)items);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar8;
  uVar9 = SUB168(auVar3 * ZEXT816(0x20),0);
  uVar17 = uVar9 + 8;
  if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar9) {
    uVar17 = 0xffffffffffffffff;
  }
  psVar11 = (size_t *)operator_new__(uVar17);
  *psVar11 = sVar8;
  local_28 = (string *)(psVar11 + 1);
  if (sVar8 != 0) {
    local_278 = local_28;
    do {
      std::__cxx11::string::string((string *)local_278);
      local_278 = local_278 + 1;
    } while (local_278 != local_28 + sVar8);
  }
  psVar10 = itemStrs;
  sVar8 = SatLookAngles::size((SatLookAngles *)items);
  *(undefined8 *)(&psVar10->_M_dataplus + sVar8 * 8) = 0;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar12 = (ostream *)std::ostream::operator<<(local_1a0,std::left);
  _Var6 = std::setw(10);
  poVar12 = std::operator<<(poVar12,_Var6);
  poVar12 = std::operator<<(poVar12,"ID");
  _Var6 = std::setw(0x19);
  poVar12 = std::operator<<(poVar12,_Var6);
  poVar12 = std::operator<<(poVar12,"NAME");
  _Var6 = std::setw(0xf);
  poVar12 = std::operator<<(poVar12,_Var6);
  poVar12 = std::operator<<(poVar12,"AZIMUTH(deg)");
  colNames.field_2._12_4_ = std::setw(0xf);
  poVar12 = std::operator<<(poVar12,(_Setw)colNames.field_2._12_4_);
  poVar12 = std::operator<<(poVar12,"ELEVATION(deg)");
  colNames.field_2._8_4_ = std::setw(0xc);
  poVar12 = std::operator<<(poVar12,(_Setw)colNames.field_2._8_4_);
  std::operator<<(poVar12,"RANGE(KM)");
  std::__cxx11::stringstream::str();
  local_1f8 = 0x19;
  piVar13 = std::max<int>((int *)&LINES,&local_1f8);
  cols = *piVar13;
  win._0_4_ = 0x50;
  piVar13 = std::max<int>((int *)&COLS,(int *)&win);
  win._4_4_ = *piVar13;
  win_00 = (WINDOW *)newwin(cols,win._4_4_,0);
  box(win_00,0x7c,0x3d);
  win_01 = (WINDOW *)newwin(0x14,0x4f,cols / 2 + -0xc,win._4_4_ / 2 + -0x27);
  wattr_on(win_01,0x40000,0);
  box(win_01,0x7c,0x2d);
  wattr_off(win_01,0x40000,0);
  uVar14 = new_panel(win_01);
  uVar15 = new_panel(win_00);
  bVar4 = false;
  menu_00 = updateMenu((MENU *)0x0,win_00,(SatLookAngles *)items,(ITEM **)itemStrs,local_28,false);
  mvwprintw(win_00,0,win._4_4_ / 2 + -0xc,"%s","}-- satnow 0.1.0 --{");
  uVar16 = std::__cxx11::string::c_str();
  mvwprintw(win_00,1,3,"%s",uVar16);
  iVar7 = wmove(win_00,cols + -3,1);
  if (iVar7 != -1) {
    whline(win_00,0x2d,win._4_4_ + -2);
  }
  mvwprintw(win_00,cols + -2,1,"%s",
            "[Quit: (q)] [Update: (space)] [Movement: (pg)up/(pg)down] [Details: (d)]");
  update_panels();
  doupdate();
  if (this->_refreshSecs < 0) {
    local_350 = -1;
  }
  else {
    local_350 = this->_refreshSecs;
  }
  wtimeout(_stdscr,local_350);
  while (iVar7 = wgetch(_stdscr), iVar7 != 0x71) {
    if ((iVar7 == -1) || (iVar7 == 0x20)) {
      updateMenu(menu_00,win_00,(SatLookAngles *)items,(ITEM **)itemStrs,local_28,true);
      refresh();
    }
    else if (iVar7 == 100) {
      bVar4 = !bVar4;
      if (bVar4) {
        uVar16 = current_item(menu_00);
        this_00 = items;
        iVar7 = item_index(uVar16);
        sat = SatLookAngles::operator[]((SatLookAngles *)this_00,(long)iVar7);
        updateInfoWindow(win_01,sat);
        show_panel(uVar14);
        top_panel(uVar14);
      }
      else {
        hide_panel(uVar14);
      }
    }
    else if (iVar7 == 0x102) {
      menu_driver(menu_00,0x203);
    }
    else if (iVar7 == 0x103) {
      menu_driver(menu_00,0x202);
    }
    else if (iVar7 == 0x152) {
      menu_driver(menu_00,0x206);
    }
    else if (iVar7 == 0x153) {
      menu_driver(menu_00,0x207);
    }
    update_panels();
    doupdate();
  }
  for (local_248 = 0; sVar8 = SatLookAngles::size((SatLookAngles *)items), local_248 < sVar8 + 1;
      local_248 = local_248 + 1) {
    free_item(*(undefined8 *)(&itemStrs->_M_dataplus + local_248 * 8));
  }
  if (itemStrs != (string *)0x0) {
    operator_delete__(itemStrs);
  }
  psVar10 = local_28;
  if (local_28 != (string *)0x0) {
    psVar5 = local_28 + -1;
    lVar1 = *(long *)((long)&local_28[-1].field_2 + 8);
    this_01 = local_28 + lVar1;
    while (psVar10 != this_01) {
      this_01 = this_01 + -1;
      std::__cxx11::string::~string((string *)this_01);
    }
    operator_delete__((void *)((long)&psVar5->field_2 + 8),lVar1 * 0x20 + 8);
  }
  delwin(win_00);
  del_panel(uVar15);
  del_panel(uVar14);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void DisplayNCurses::render(SatLookAngles &sats) {
#if HAVE_GUI
  // Build the menu and have a place to store the strings.
  auto items = new ITEM *[sats.size() + 1]();
  auto itemStrs = new std::string[sats.size()];
  items[sats.size()] = nullptr;

  // Column names.
  std::stringstream ss;
  ss << std::left << std::setw(10) << "ID" << std::setw(25) << "NAME"
     << std::setw(15) << "AZIMUTH(deg)" << std::setw(15) << "ELEVATION(deg)"
     << std::setw(12) << "RANGE(KM)";
  std::string colNames = ss.str();

  // Create a window to decorate the menu with.
  const int rows = std::max(LINES, 25);
  const int cols = std::max(COLS, 80);
  auto win = newwin(rows, cols, 0, 0);
  box(win, '|', '=');

  // Create another window to hold selected information.
  auto infoWin = newwin(20, 79, (rows / 2) - 12, (cols / 2) - 39);
  wattron(infoWin, A_REVERSE);
  box(infoWin, '|', '-');
  wattroff(infoWin, A_REVERSE);

  // Create panels.
  auto infoPanel = new_panel(infoWin);
  auto mainPanel = new_panel(win);
  bool showInfo = false;

  // Populate menu ('false' avoids calculating new look angles);
  MENU *menu = updateMenu(nullptr, win, sats, items, itemStrs, false);

  // Add title and column names.
  mvwprintw(win, 0, (cols / 2 - 12), "%s", "}-- satnow " VER " --{");
  mvwprintw(win, 1, 3, "%s", colNames.c_str());

  // Print a legend at the bottom.
  mvwhline(win, rows - 3, 1, '-', cols - 2);
  mvwprintw(win, rows - 2, 1, "%s",
            "[Quit: (q)] [Update: (space)] "
            "[Movement: (pg)up/(pg)down] [Details: (d)]");

  // Display.
  update_panels();
  doupdate();
  const int msecs = (_refreshSecs < 0) ? -1 : _refreshSecs;
  timeout(msecs);
  int c;
  while ((c = getch()) != 'q') {
    switch (c) {
    case KEY_DOWN:
      menu_driver(menu, REQ_DOWN_ITEM);
      break;
    case KEY_UP:
      menu_driver(menu, REQ_UP_ITEM);
      break;
    case KEY_NPAGE:
      menu_driver(menu, REQ_SCR_DPAGE);
      break;
    case KEY_PPAGE:
      menu_driver(menu, REQ_SCR_UPAGE);
      break;
    case 'd':
      showInfo = showInfo ^ true;
      // Swap the main and info panel.
      if (showInfo) {
        const ITEM *ci = current_item(menu);
        updateInfoWindow(infoWin, sats[item_index(ci)]);
        show_panel(infoPanel);
        top_panel(infoPanel);
      } else
        hide_panel(infoPanel);
      break;
    case ' ':
    case ERR:
      updateMenu(menu, win, sats, items, itemStrs, true);
      refresh();
      break;
    }
    update_panels();
    doupdate();
  }

  // Cleanup.
  for (size_t i = 0; i < sats.size() + 1; ++i)
    free_item(items[i]);
  delete[] items;
  delete[] itemStrs;
  delwin(win);
  del_panel(mainPanel);
  del_panel(infoPanel);
#endif // HAVE_GUI
}